

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# program_options.cpp
# Opt level: O0

SharedOptPtr __thiscall
Potassco::ProgramOptions::anon_unknown_15::DefaultContext::getOption
          (DefaultContext *this,int param_2,char *tok)

{
  code *pcVar1;
  undefined8 uVar2;
  char *in_RCX;
  long *in_RSI;
  Option *in_RDI;
  string optName;
  byte local_7d;
  allocator local_61;
  string local_60 [32];
  string local_40 [32];
  char *local_20;
  
  local_20 = in_RCX;
  std::__cxx11::string::string(local_40);
  local_7d = 1;
  if (in_RSI[1] != 0) {
    pcVar1 = (code *)in_RSI[1];
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_60,local_20,&local_61);
    local_7d = (*pcVar1)(local_60,local_40);
    local_7d = local_7d ^ 0xff;
    std::__cxx11::string::~string(local_60);
    std::allocator<char>::~allocator((allocator<char> *)&local_61);
  }
  if ((local_7d & 1) == 0) {
    uVar2 = std::__cxx11::string::c_str();
    (**(code **)(*in_RSI + 0x10))(in_RDI,in_RSI,uVar2,3);
  }
  else {
    (**(code **)(*in_RSI + 0x10))(in_RDI,in_RSI,"Positional Option",3);
  }
  std::__cxx11::string::~string(local_40);
  return (SharedOptPtr)in_RDI;
}

Assistant:

SharedOptPtr  getOption(int, const char* tok) {
		std::string optName;
		if (!posOpt || !posOpt(tok, optName)) { return getOption("Positional Option", OptionContext::find_name_or_prefix); }
		return getOption(optName.c_str(), OptionContext::find_name_or_prefix);
	}